

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O3

string * GetPublicIPv4_abi_cxx11_(void)

{
  uint uVar1;
  long lVar2;
  string *in_RDI;
  long httpResponse;
  char curl_errtxt [256];
  _Alloc_hider local_140;
  size_type local_138;
  char local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  long local_120;
  undefined1 local_118 [256];
  
  local_138 = 0;
  local_130 = '\0';
  local_140._M_p = &local_130;
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x2ac,"GetPublicIPv4",logERR,"Could not initialize easy CURL");
    }
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
    if (local_140._M_p == &local_130) {
      return in_RDI;
    }
    operator_delete(local_140._M_p,CONCAT71(uStack_12f,local_130) + 1);
    return in_RDI;
  }
  std::__cxx11::string::reserve((ulong)&local_140);
  curl_easy_setopt(lVar2,99,1);
  curl_easy_setopt(lVar2,0xd,5);
  curl_easy_setopt(lVar2,0x271a,local_118);
  curl_easy_setopt(lVar2,0x4e2b,CBReadToStringBuf);
  curl_easy_setopt(lVar2,0x2711,&local_140);
  curl_easy_setopt(lVar2,0x2722,HTTP_USER_AGENT);
  curl_easy_setopt(lVar2,0x2712,"https://api.ipify.org/");
  curl_easy_setopt(lVar2,0xd8,2);
  uVar1 = curl_easy_perform(lVar2);
  if (uVar1 == 0) {
    local_120 = 0;
    curl_easy_getinfo(lVar2,0x200002);
    if (local_120 == 200) goto LAB_0014bd97;
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x2c3,"GetPublicIPv4",logERR,"HTPP response was not OK but %d");
    }
  }
  else if ((int)dataRefs.iLogLevel < 4) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
           ,0x2c8,"GetPublicIPv4",logERR,"CURL call failed (%d)",(ulong)uVar1);
  }
  local_138 = 0;
  *local_140._M_p = '\0';
LAB_0014bd97:
  curl_easy_cleanup(lVar2);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (local_140._M_p == &local_130) {
    (in_RDI->field_2)._M_allocated_capacity = CONCAT71(uStack_12f,local_130);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uStack_128;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = local_140._M_p;
    (in_RDI->field_2)._M_allocated_capacity = CONCAT71(uStack_12f,local_130);
  }
  in_RDI->_M_string_length = local_138;
  return in_RDI;
}

Assistant:

std::string GetPublicIPv4 ()
{
    char curl_errtxt[CURL_ERROR_SIZE];
    std::string readBuf;
    
    // initialize the CURL handle
    CURL *pCurl = curl_easy_init();
    if (!pCurl) {
        LOG_MSG(logERR,ERR_CURL_EASY_INIT);
        return "";
    }

    // Setup buffer and CURL handle
    readBuf.reserve(CURL_MAX_WRITE_SIZE);
    curl_easy_setopt(pCurl, CURLOPT_NOSIGNAL, 1);
    curl_easy_setopt(pCurl, CURLOPT_TIMEOUT, 5);
    curl_easy_setopt(pCurl, CURLOPT_ERRORBUFFER, curl_errtxt);
    curl_easy_setopt(pCurl, CURLOPT_WRITEFUNCTION, CBReadToStringBuf);
    curl_easy_setopt(pCurl, CURLOPT_WRITEDATA, &readBuf);
    curl_easy_setopt(pCurl, CURLOPT_USERAGENT, HTTP_USER_AGENT);
    curl_easy_setopt(pCurl, CURLOPT_URL, "https://api.ipify.org/");
    curl_easy_setopt(pCurl, CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);

    // Perform the CURL call to read from the URL
    const CURLcode cc = curl_easy_perform(pCurl);
    if (cc == CURLE_OK) {
        // CURL was OK, now check HTTP response code
        long httpResponse = 0;
        curl_easy_getinfo(pCurl, CURLINFO_RESPONSE_CODE, &httpResponse);
        // Not HTTP_OK?
        if (httpResponse != HTTP_OK) {
            LOG_MSG(logERR, "HTPP response was not OK but %d", (int)httpResponse);
            readBuf.clear();
        }

    } else {
        LOG_MSG(logERR, "CURL call failed (%d)", (int)cc);
        readBuf.clear();
    }
    
    // cleanup CURL handle
    curl_easy_cleanup(pCurl);
    
    // return what we've read
    return readBuf;
}